

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O3

from_chars_result __thiscall
semver::detail::version_parser::parse<int,int,int>(version_parser *this,version<int,_int,_int> *out)

{
  pointer ptVar1;
  token_type tVar2;
  from_chars_result fVar3;
  from_chars_result fVar4;
  byte *pbVar5;
  size_t sVar6;
  pointer ptVar7;
  token_stream *ptVar9;
  pointer ptVar10;
  undefined8 uVar11;
  size_t sVar12;
  ulong uVar13;
  from_chars_result fVar14;
  undefined8 local_38;
  char *local_30;
  char *pcVar8;
  
  out->major_ = 0;
  out->minor_ = 1;
  out->patch_ = 0;
  (out->prerelease_tag_)._M_string_length = 0;
  *(out->prerelease_tag_)._M_dataplus._M_p = '\0';
  std::
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ::_M_erase_at_end(&out->prerelease_identifiers,
                    (out->prerelease_identifiers).
                    super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (out->build_metadata_)._M_string_length = 0;
  *(out->build_metadata_)._M_dataplus._M_p = '\0';
  ptVar9 = this->stream;
  sVar6 = ptVar9->current;
  ptVar10 = (ptVar9->tokens).
            super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ptVar7 = ptVar10 + sVar6;
  local_38._0_1_ = ptVar7->type;
  local_38._1_2_ = ptVar7->value;
  local_38._3_5_ = *(undefined5 *)&ptVar7->field_0x3;
  local_30 = ptVar10[sVar6].lexeme;
  ptVar9->current = sVar6 + 1;
  if ((undefined1)local_38 == '\x06') {
    pbVar5 = std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         *)((long)&local_38 + 1));
    uVar13 = (ulong)*pbVar5;
    ptVar9 = this->stream;
    if (uVar13 == 0) {
      uVar13 = 0;
    }
    else {
      sVar6 = ptVar9->current;
      ptVar10 = (ptVar9->tokens).
                super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ptVar7 = ptVar10 + sVar6;
      local_38._0_1_ = ptVar7->type;
      local_38._1_2_ = ptVar7->value;
      local_38._3_5_ = *(undefined5 *)&ptVar7->field_0x3;
      if ((undefined1)local_38 == '\x06') {
        ptVar10 = ptVar10 + sVar6;
        do {
          local_30 = ptVar10->lexeme;
          ptVar9->current = sVar6 + 1;
          pbVar5 = std::
                   get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                             ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                               *)((long)&local_38 + 1));
          uVar13 = (ulong)*pbVar5 + uVar13 * 10;
          ptVar9 = this->stream;
          sVar6 = ptVar9->current;
          ptVar7 = (ptVar9->tokens).
                   super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ptVar10 = ptVar7 + sVar6;
          ptVar7 = ptVar7 + sVar6;
          local_38._0_1_ = ptVar7->type;
          local_38._1_2_ = ptVar7->value;
          local_38._3_5_ = *(undefined5 *)&ptVar7->field_0x3;
        } while ((undefined1)local_38 == '\x06');
        if (0x7fffffff < uVar13) goto LAB_001034ac;
      }
    }
    out->major_ = (int)uVar13;
    sVar12 = ptVar9->current;
    ptVar7 = (ptVar9->tokens).
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    tVar2 = ptVar7[sVar12].type;
    sVar6 = sVar12 + 1;
    ptVar9->current = sVar6;
    if (tVar2 == dot) {
      ptVar10 = ptVar7 + sVar6;
      local_38._0_1_ = ptVar10->type;
      local_38._1_2_ = ptVar10->value;
      local_38._3_5_ = *(undefined5 *)&ptVar10->field_0x3;
      local_30 = ptVar7[sVar6].lexeme;
      ptVar9->current = sVar12 + 2;
      if ((undefined1)local_38 != '\x06') goto LAB_0010368c;
      pbVar5 = std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                           *)((long)&local_38 + 1));
      uVar13 = (ulong)*pbVar5;
      ptVar9 = this->stream;
      if (uVar13 == 0) {
        uVar13 = 0;
      }
      else {
        sVar6 = ptVar9->current;
        ptVar10 = (ptVar9->tokens).
                  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ptVar7 = ptVar10 + sVar6;
        local_38._0_1_ = ptVar7->type;
        local_38._1_2_ = ptVar7->value;
        local_38._3_5_ = *(undefined5 *)&ptVar7->field_0x3;
        if ((undefined1)local_38 == '\x06') {
          ptVar10 = ptVar10 + sVar6;
          do {
            local_30 = ptVar10->lexeme;
            ptVar9->current = sVar6 + 1;
            pbVar5 = std::
                     get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                               ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                                 *)((long)&local_38 + 1));
            uVar13 = (ulong)*pbVar5 + uVar13 * 10;
            ptVar9 = this->stream;
            sVar6 = ptVar9->current;
            ptVar7 = (ptVar9->tokens).
                     super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ptVar10 = ptVar7 + sVar6;
            ptVar7 = ptVar7 + sVar6;
            local_38._0_1_ = ptVar7->type;
            local_38._1_2_ = ptVar7->value;
            local_38._3_5_ = *(undefined5 *)&ptVar7->field_0x3;
          } while ((undefined1)local_38 == '\x06');
          if (0x7fffffff < uVar13) goto LAB_001034ac;
        }
      }
      out->minor_ = (int)uVar13;
      sVar12 = ptVar9->current;
      ptVar7 = (ptVar9->tokens).
               super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
               _M_impl.super__Vector_impl_data._M_start;
      tVar2 = ptVar7[sVar12].type;
      sVar6 = sVar12 + 1;
      ptVar9->current = sVar6;
      if (tVar2 == dot) {
        ptVar10 = ptVar7 + sVar6;
        local_38._0_1_ = ptVar10->type;
        local_38._1_2_ = ptVar10->value;
        local_38._3_5_ = *(undefined5 *)&ptVar10->field_0x3;
        local_30 = ptVar7[sVar6].lexeme;
        ptVar9->current = sVar12 + 2;
        if ((undefined1)local_38 == '\x06') {
          pbVar5 = std::
                   get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                             ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                               *)((long)&local_38 + 1));
          uVar13 = (ulong)*pbVar5;
          if (uVar13 == 0) {
            out->patch_ = 0;
            ptVar9 = this->stream;
            sVar6 = ptVar9->current;
            ptVar7 = (ptVar9->tokens).
                     super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            ptVar9 = this->stream;
            sVar6 = ptVar9->current;
            ptVar7 = (ptVar9->tokens).
                     super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ptVar10 = ptVar7 + sVar6;
            uVar11._0_1_ = ptVar10->type;
            uVar11._1_2_ = ptVar10->value;
            uVar11._3_5_ = *(undefined5 *)&ptVar10->field_0x3;
            if ((undefined1)uVar11 == '\x06') {
              ptVar10 = ptVar7 + sVar6;
              do {
                local_30 = ptVar10->lexeme;
                ptVar9->current = sVar6 + 1;
                local_38 = uVar11;
                pbVar5 = std::
                         get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                                   ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                                     *)((long)&local_38 + 1));
                uVar13 = (ulong)*pbVar5 + uVar13 * 10;
                ptVar9 = this->stream;
                sVar6 = ptVar9->current;
                ptVar7 = (ptVar9->tokens).
                         super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ptVar10 = ptVar7 + sVar6;
                ptVar1 = ptVar7 + sVar6;
                uVar11._0_1_ = ptVar1->type;
                uVar11._1_2_ = ptVar1->value;
                uVar11._3_5_ = *(undefined5 *)&ptVar1->field_0x3;
              } while ((undefined1)uVar11 == '\x06');
              if (0x7fffffff < uVar13) {
LAB_001034ac:
                fVar14._8_8_ = 0x22;
                fVar14.ptr = local_30;
                return (from_chars_result)fVar14;
              }
            }
            out->patch_ = (int)uVar13;
          }
          sVar12 = ptVar9->current;
          tVar2 = (ptVar9->tokens).
                  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                  _M_impl.super__Vector_impl_data._M_start[sVar12].type;
          if (tVar2 == hyphen) {
            ptVar9->current = sVar12 + 1;
            fVar14 = (from_chars_result)
                     parse_prerelease_tag(this,&out->prerelease_tag_,&out->prerelease_identifiers);
            pcVar8 = fVar14.ptr;
            if (fVar14.ec != 0) {
              return (from_chars_result)fVar14;
            }
            ptVar9 = this->stream;
            sVar12 = ptVar9->current;
            tVar2 = (ptVar9->tokens).
                    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar12].type;
          }
          else {
            pcVar8 = ptVar7[sVar6].lexeme;
          }
          fVar3._8_8_ = 0;
          fVar3.ptr = pcVar8;
          if (tVar2 != plus) {
            return (from_chars_result)fVar3;
          }
          ptVar9->current = sVar12 + 1;
          fVar14 = (from_chars_result)parse_build_metadata(this,&out->build_metadata_);
          return (from_chars_result)fVar14;
        }
        goto LAB_0010368c;
      }
    }
    local_30 = ptVar7[sVar6 - 1].lexeme;
  }
LAB_0010368c:
  fVar4._8_8_ = 0x16;
  fVar4.ptr = local_30;
  return (from_chars_result)fVar4;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(version<I1, I2, I3>& out) noexcept {
    out.clear();

    from_chars_result result = parse_number(out.major_); 
    if (!result) {
      return result;
    }

    if (!stream.consume(token_type::dot)) {
      return failure(stream.previous().lexeme);
    }

    result = parse_number(out.minor_);
    if (!result) {
      return result;
    }

    if (!stream.consume(token_type::dot)) {
      return failure(stream.previous().lexeme);
    }

    result = parse_number(out.patch_);
    if (!result) {
      return result;
    }

    if (stream.advanceIfMatch(token_type::hyphen)) {
      result = parse_prerelease_tag(out.prerelease_tag_, out.prerelease_identifiers);
      if (!result) {
        return result;
      }
    }

    if (stream.advanceIfMatch(token_type::plus)) {
      result = parse_build_metadata(out.build_metadata_);
      if (!result) {
        return result;
      }
    }

    return result;
  }